

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderSupplementalData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderSupplementalData::Decode
          (Mode5TransponderSupplementalData *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 != 0) {
    KDataStream::Read(stream,&(this->m_SupplementalDataUnion).m_ui8SupplementalData);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Mode5TransponderSupplementalData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < MODE_5_TRANSPONDER_SUPPLEMENTAL_DATA_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );
	
	stream >> m_SupplementalDataUnion.m_ui8SupplementalData;
}